

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O2

char * __thiscall crypto::xchacha20::crypt(xchacha20 *this,char *__key,char *__salt)

{
  byte bVar1;
  uint uVar2;
  char *in_RAX;
  long in_RCX;
  size_t i;
  long lVar3;
  
  for (lVar3 = 0; in_RCX != lVar3; lVar3 = lVar3 + 1) {
    bVar1 = this->pos;
    if (bVar1 == 0x40) {
      update(this);
      this->pos = '\0';
      bVar1 = 0;
    }
    uVar2 = *(uint *)((long)this->keystream + (ulong)(bVar1 & 0xfc)) >> ((bVar1 & 3) << 3);
    bVar1 = (byte)uVar2 ^ __key[lVar3];
    in_RAX = (char *)(ulong)CONCAT31((int3)(uVar2 >> 8),bVar1);
    __salt[lVar3] = bVar1;
    this->pos = this->pos + '\x01';
  }
  return in_RAX;
}

Assistant:

void xchacha20::crypt(const char * in, char * out, size_t length) {
	
	// asume pos > 0 && pos <= 64
	
	for(size_t i = 0; i < length; i++, pos++) {
		if(pos == sizeof(keystream)) {
			update();
			pos = 0;
		}
		boost::uint8_t key = boost::uint8_t(keystream[pos / sizeof(word)] >> ((pos % sizeof(word)) * 8));
		out[i] = char(boost::uint8_t(in[i]) ^ key);
	}
	
}